

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O1

void __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
skipWhitespaceAndComments
          (Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           *this)

{
  UTF8Reader *this_00;
  _Alloc_hider _Var1;
  UnicodeChar UVar2;
  uint uVar3;
  UTF8Reader temp_1;
  UTF8Reader t;
  UTF8Reader local_70;
  CompileMessage local_68;
  
  this_00 = &this->input;
  while( true ) {
    local_68.description._M_dataplus._M_p = this_00->data;
    while ((_Var1._M_p = local_68.description._M_dataplus._M_p,
           (byte)*local_68.description._M_dataplus._M_p - 9 < 5 ||
           (*local_68.description._M_dataplus._M_p == 0x20))) {
      UTF8Reader::operator++((UTF8Reader *)&local_68);
    }
    this_00->data = local_68.description._M_dataplus._M_p;
    UVar2 = UTF8Reader::operator*(this_00);
    if (UVar2 != 0x2f) break;
    local_68.description._M_dataplus._M_p = _Var1._M_p;
    UTF8Reader::operator++((UTF8Reader *)&local_68);
    UVar2 = UTF8Reader::operator*((UTF8Reader *)&local_68);
    if (UVar2 == 0x2a) {
      local_70.data = (this->input).data;
      (this->location).location.data = local_70.data;
      uVar3 = 3;
      do {
        UTF8Reader::operator++(&local_70);
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
      UTF8Reader::find((UTF8Reader *)&local_68,(char *)&local_70);
      this_00->data = local_68.description._M_dataplus._M_p;
      if (*local_68.description._M_dataplus._M_p == 0) {
        CompileMessageHelpers::createMessage<>(&local_68,syntax,error,"Unterminated \'/*\' comment")
        ;
        (*this->_vptr_Tokeniser[2])(this,&local_68);
        RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_68.location.sourceCode.object);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_68.description._M_dataplus._M_p != &local_68.description.field_2) {
          operator_delete(local_68.description._M_dataplus._M_p,
                          local_68.description.field_2._M_allocated_capacity + 1);
        }
      }
      uVar3 = 3;
      do {
        UTF8Reader::operator++(this_00);
        uVar3 = uVar3 - 1;
      } while (1 < uVar3);
    }
    else {
      if (UVar2 != 0x2f) {
        return;
      }
      UTF8Reader::find((UTF8Reader *)&local_68,(char *)this_00);
      this_00->data = local_68.description._M_dataplus._M_p;
    }
  }
  return;
}

Assistant:

void skipWhitespaceAndComments()
    {
        for (;;)
        {
            input = input.findEndOfWhitespace();

            if (*input == '/')
            {
                auto c2 = *(input + 1);

                if (c2 == '/')  { input = input.find ("\n"); continue; }

                if (c2 == '*')
                {
                    location.location = input;
                    input = (input + 2).find ("*/");
                    if (input.isEmpty()) throwError (Errors::unterminatedComment());
                    input += 2; continue;
                }
            }

            break;
        }
    }